

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void doSanityChecks(Section *section,void *ptr)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint16_t uVar5;
  char *pcVar6;
  uint32_t maxbank;
  uint32_t minbank;
  void *ptr_local;
  Section *section_local;
  
  if (((int)section->type < 0) || (7 < (int)section->type)) {
    error((FileStackNode *)0x0,0,"Section \"%s\" has an invalid type",section->name);
  }
  else {
    if ((is32kMode) && (section->type == SECTTYPE_ROMX)) {
      if (((section->isBankFixed & 1U) == 0) || (section->bank == 1)) {
        section->type = SECTTYPE_ROM0;
      }
      else {
        error((FileStackNode *)0x0,0,"%s: ROMX sections must be in bank 1 (if any) with option -t",
              section->name);
      }
    }
    if (((isWRA0Mode & 1U) != 0) && (section->type == SECTTYPE_WRAMX)) {
      if (((section->isBankFixed & 1U) == 0) || (section->bank == 1)) {
        section->type = SECTTYPE_WRAM0;
      }
      else {
        error((FileStackNode *)0x0,0,"%s: WRAMX sections must be in bank 1 with options -w or -d",
              section->name);
      }
    }
    if ((((isDmgMode & 1U) != 0) && (section->type == SECTTYPE_VRAM)) && (section->bank == 1)) {
      error((FileStackNode *)0x0,0,"%s: VRAM bank 1 can\'t be used with option -d",section->name);
    }
    if (((section->isAlignFixed & 1U) != 0) && (section->alignMask == 0)) {
      section->isAlignFixed = false;
    }
    if (((section->isAlignFixed & 1U) != 0) &&
       ((section->alignMask & sectionTypeInfo[section->type].startAddr) != 0)) {
      error((FileStackNode *)0x0,0,"%s: %s sections cannot be aligned to $%04x bytes",section->name,
            sectionTypeInfo[section->type].name,(ulong)(section->alignMask + 1));
    }
    uVar3 = sectionTypeInfo[section->type].firstBank;
    uVar4 = sectionTypeInfo[section->type].lastBank;
    if ((((section->isBankFixed & 1U) != 0) && (section->bank < uVar3)) && (uVar4 < section->bank))
    {
      pcVar6 = "Cannot place section \"%s\" in bank %u, it must be between %u and %u";
      if (uVar3 == uVar4) {
        pcVar6 = "Cannot place section \"%s\" in bank %u, it must be %u";
      }
      error((FileStackNode *)0x0,0,pcVar6,section->name,(ulong)section->bank,(ulong)uVar3,uVar4);
    }
    if (sectionTypeInfo[section->type].size < section->size) {
      error((FileStackNode *)0x0,0,
            "Section \"%s\" is bigger than the max size for that type: $%x > $%x",section->name,
            (ulong)section->size,(ulong)sectionTypeInfo[section->type].size);
    }
    if (uVar3 == uVar4) {
      section->bank = uVar3;
      section->isBankFixed = true;
    }
    if ((section->isAddressFixed & 1U) != 0) {
      if ((section->isAlignFixed & 1U) != 0) {
        if ((section->org & section->alignMask) != section->alignOfs) {
          error((FileStackNode *)0x0,0,
                "Section \"%s\"\'s fixed address doesn\'t match its alignment",section->name);
        }
        section->isAlignFixed = false;
      }
      if ((section->org < sectionTypeInfo[section->type].startAddr) ||
         (uVar1 = section->org, uVar5 = endaddr(section->type), uVar5 < uVar1)) {
        pcVar6 = section->name;
        uVar1 = section->org;
        uVar2 = sectionTypeInfo[section->type].startAddr;
        uVar5 = endaddr(section->type);
        error((FileStackNode *)0x0,0,
              "Section \"%s\"\'s fixed address $%04x is outside of range [$%04x; $%04x]",pcVar6,
              (ulong)uVar1,(ulong)uVar2,(uint)uVar5);
      }
      uVar1 = section->org;
      uVar2 = section->size;
      uVar5 = endaddr(section->type);
      if (uVar5 + 1 < (uint)uVar1 + (uint)uVar2) {
        pcVar6 = section->name;
        uVar1 = section->org;
        uVar2 = section->size;
        uVar5 = endaddr(section->type);
        error((FileStackNode *)0x0,0,
              "Section \"%s\"\'s end address $%04x is greater than last address $%04x",pcVar6,
              (ulong)((uint)uVar1 + (uint)uVar2),(ulong)(uVar5 + 1));
      }
    }
  }
  return;
}

Assistant:

static void doSanityChecks(struct Section *section, void *ptr)
{
	(void)ptr;

	// Sanity check the section's type

	if (section->type < 0 || section->type >= SECTTYPE_INVALID) {
		error(NULL, 0, "Section \"%s\" has an invalid type", section->name);
		return;
	}

	if (is32kMode && section->type == SECTTYPE_ROMX) {
		if (section->isBankFixed && section->bank != 1)
			error(NULL, 0, "%s: ROMX sections must be in bank 1 (if any) with option -t",
			     section->name);
		else
			section->type = SECTTYPE_ROM0;
	}
	if (isWRA0Mode && section->type == SECTTYPE_WRAMX) {
		if (section->isBankFixed && section->bank != 1)
			error(NULL, 0, "%s: WRAMX sections must be in bank 1 with options -w or -d",
			     section->name);
		else
			section->type = SECTTYPE_WRAM0;
	}
	if (isDmgMode && section->type == SECTTYPE_VRAM && section->bank == 1)
		error(NULL, 0, "%s: VRAM bank 1 can't be used with option -d",
		     section->name);

	// Check if alignment is reasonable, this is important to avoid UB
	// An alignment of zero is equivalent to no alignment, basically
	if (section->isAlignFixed && section->alignMask == 0)
		section->isAlignFixed = false;

	// Too large an alignment may not be satisfiable
	if (section->isAlignFixed && (section->alignMask & sectionTypeInfo[section->type].startAddr))
		error(NULL, 0, "%s: %s sections cannot be aligned to $%04x bytes",
		     section->name, sectionTypeInfo[section->type].name, section->alignMask + 1);

	uint32_t minbank = sectionTypeInfo[section->type].firstBank, maxbank = sectionTypeInfo[section->type].lastBank;

	if (section->isBankFixed && section->bank < minbank && section->bank > maxbank)
		error(NULL, 0, minbank == maxbank
			? "Cannot place section \"%s\" in bank %" PRIu32 ", it must be %" PRIu32
			: "Cannot place section \"%s\" in bank %" PRIu32 ", it must be between %" PRIu32 " and %" PRIu32,
		     section->name, section->bank, minbank, maxbank);

	// Check if section has a chance to be placed
	if (section->size > sectionTypeInfo[section->type].size)
		error(NULL, 0, "Section \"%s\" is bigger than the max size for that type: $%"
		      PRIx16 " > $%" PRIx16,
		      section->name, section->size, sectionTypeInfo[section->type].size);

	// Translate loose constraints to strong ones when they're equivalent

	if (minbank == maxbank) {
		section->bank = minbank;
		section->isBankFixed = true;
	}

	if (section->isAddressFixed) {
		// It doesn't make sense to have both org and alignment set
		if (section->isAlignFixed) {
			if ((section->org & section->alignMask) != section->alignOfs)
				error(NULL, 0, "Section \"%s\"'s fixed address doesn't match its alignment",
				     section->name);
			section->isAlignFixed = false;
		}

		// Ensure the target address is valid
		if (section->org < sectionTypeInfo[section->type].startAddr
		 || section->org > endaddr(section->type))
			error(NULL, 0, "Section \"%s\"'s fixed address $%04" PRIx16 " is outside of range [$%04"
			     PRIx16 "; $%04" PRIx16 "]", section->name, section->org,
			     sectionTypeInfo[section->type].startAddr, endaddr(section->type));

		if (section->org + section->size > endaddr(section->type) + 1)
			error(NULL, 0, "Section \"%s\"'s end address $%04x is greater than last address $%04x",
			      section->name, section->org + section->size,
			      endaddr(section->type) + 1);
	}

#undef fail
}